

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffikls(fitsfile *fptr,char *keyname,char *value,char *comm,int *status)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *in_RDX;
  char *in_RSI;
  int *in_R8;
  int tstatus;
  int contin;
  int namelen;
  int nchar;
  int nquote;
  int vlen;
  int remain;
  int next;
  char *cptr;
  char tstring [71];
  char tmpkeyname [81];
  char card [81];
  char valstring [71];
  int local_1a4;
  int local_1a0;
  int iVar6;
  char *in_stack_fffffffffffffe78;
  int *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  char acStack_d0 [8];
  int *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  fitsfile *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char local_78 [72];
  int *local_30;
  char *local_20;
  char *local_18;
  int local_4;
  
  if (*in_R8 < 1) {
    local_30 = in_R8;
    local_20 = in_RDX;
    local_18 = in_RSI;
    sVar4 = strlen(in_RDX);
    iVar3 = (int)sVar4;
    iVar6 = 0;
    local_1a0 = 0;
    for (pcVar5 = strchr(local_20,0x27); pcVar5 != (char *)0x0; pcVar5 = strchr(pcVar5 + 1,0x27)) {
      local_1a0 = local_1a0 + 1;
    }
    strncpy(&stack0xfffffffffffffec8,local_18,0x50);
    for (pcVar5 = &stack0xfffffffffffffec8; *pcVar5 == ' '; pcVar5 = pcVar5 + 1) {
    }
    sVar4 = strlen(pcVar5);
    if (((int)sVar4 < 9) &&
       (iVar2 = fftkey(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0), iVar2 < 1)) {
      local_1a4 = 0x44 - local_1a0;
    }
    else {
      local_1a4 = (-(int)sVar4 - local_1a0) + 0x4b;
    }
    bVar1 = false;
    while (0 < iVar3) {
      if (0x46 < local_1a4) {
        ffpmsg((char *)0x2106a7);
        *local_30 = 0xcf;
        return 0xcf;
      }
      strncpy(&stack0xfffffffffffffe78,local_20 + iVar6,(long)local_1a4);
      (&stack0xfffffffffffffe78)[local_1a4] = 0;
      ffs2c(in_stack_fffffffffffffe78,pcVar5,(int *)CONCAT44(iVar6,iVar3));
      if (local_1a4 < iVar3) {
        sVar4 = strlen(local_78);
        iVar2 = (int)sVar4;
        local_1a4 = local_1a4 + -1;
        if (local_78[iVar2 + -2] == '\'') {
          local_78[iVar2 + -3] = '&';
          local_78[iVar2 + -1] = '\0';
        }
        else {
          local_78[iVar2 + -2] = '&';
        }
      }
      if (bVar1) {
        ffmkky(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->HDUposition);
        strncpy(acStack_d0,"   ",2);
      }
      else {
        ffmkky(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->HDUposition);
      }
      ffikey(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      bVar1 = true;
      iVar6 = local_1a4 + iVar6;
      iVar3 = iVar3 - local_1a4;
      local_1a4 = 0x44 - local_1a0;
    }
    local_4 = *local_30;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffikls( fitsfile *fptr,           /* I - FITS file pointer        */
            const char *keyname,      /* I - name of keyword to write */
            const char *value,        /* I - keyword value            */
            const char *comm,         /* I - keyword comment          */
            int  *status)             /* IO - error status            */
/*
  Insert a long string keyword.  This routine supports the
  HEASARC long string convention and can insert arbitrarily long string
  keyword values.  The value is continued over multiple keywords that
  have the name COMTINUE without an equal sign in column 9 of the card.
  This routine also supports simple string keywords which are less than
  69 characters in length.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD], tmpkeyname[FLEN_CARD];
    char tstring[FLEN_VALUE], *cptr;
    int next, remain, vlen, nquote, nchar, namelen, contin, tstatus = -1;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*  construct the new keyword, and insert into header */
    remain = strlen(value);    /* number of characters to write out */
    next = 0;                  /* pointer to next character to write */
    
    /* count the number of single quote characters in the string */
    nquote = 0;
    cptr = strchr(value, '\'');   /* search for quote character */

    while (cptr)  /* search for quote character */
    {
        nquote++;            /*  increment no. of quote characters  */
        cptr++;              /*  increment pointer to next character */
        cptr = strchr(cptr, '\'');  /* search for another quote char */
    }


    strncpy(tmpkeyname, keyname, 80);
    tmpkeyname[80] = '\0';
    
    cptr = tmpkeyname;
    while(*cptr == ' ')   /* skip over leading spaces in name */
        cptr++;

    /* determine the number of characters that will fit on the line */
    /* Note: each quote character is expanded to 2 quotes */

    namelen = strlen(cptr);
    if (namelen <= 8 && (fftkey(cptr, &tstatus) <= 0) )
    {
        /* This a normal 8-character FITS keyword */
        nchar = 68 - nquote; /*  max of 68 chars fit in a FITS string value */
    }
    else
    {
	nchar = 80 - nquote - namelen - 5;
    }

    contin = 0;
    while (remain > 0)
    {
        if (nchar > FLEN_VALUE-1)
        {
           ffpmsg("longstr keyword value is too long (ffikls)");
           return (*status=BAD_KEYCHAR);
        }
        strncpy(tstring, &value[next], nchar); /* copy string to temp buff */
        tstring[nchar] = '\0';
        ffs2c(tstring, valstring, status);  /* put quotes around the string */

        if (remain > nchar)   /* if string is continued, put & as last char */
        {
            vlen = strlen(valstring);
            nchar -= 1;        /* outputting one less character now */

            if (valstring[vlen-2] != '\'')
                valstring[vlen-2] = '&';  /*  over write last char with &  */
            else
            { /* last char was a pair of single quotes, so over write both */
                valstring[vlen-3] = '&';
                valstring[vlen-1] = '\0';
            }
        }

        if (contin)           /* This is a CONTINUEd keyword */
        {
           ffmkky("CONTINUE", valstring, comm, card, status); /* make keyword */
           strncpy(&card[8], "   ",  2);  /* overwrite the '=' */
        }
        else
        {
           ffmkky(keyname, valstring, comm, card, status);  /* make keyword */
        }

        ffikey(fptr, card, status);  /* insert the keyword */
       
        contin = 1;
        remain -= nchar;
        next  += nchar;
        nchar = 68 - nquote;
    }
    return(*status);
}